

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68000_bchg_s(m68k_info *info)

{
  uint imm;
  ulong uVar1;
  
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  imm = 0xaa;
  if (uVar1 + 2 <= info->code_len) {
    imm = (uint)info->code[uVar1 + 1];
  }
  info->pc = info->pc + 2;
  build_imm_ea(info,0x1d,'\x01',imm);
  return;
}

Assistant:

static void d68000_bchg_s(m68k_info *info)
{
	build_imm_ea(info, M68K_INS_BCHG, 1, read_imm_8(info));
}